

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::primitiveTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GLenum primitive)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "points";
    __a = &local_9;
    break;
  case 1:
    __s = "lines";
    __a = &local_a;
    break;
  case 2:
    __s = "line_loop";
    __a = &local_b;
    break;
  case 3:
    __s = "line_strip";
    __a = &local_c;
    break;
  case 4:
    __s = "triangles";
    __a = &local_f;
    break;
  case 5:
    __s = "triangle_strip";
    __a = &local_10;
    break;
  case 6:
    __s = "triangle_fan";
    __a = &local_11;
    break;
  default:
    __s = "error";
    __a = &local_14;
    break;
  case 10:
    __s = "lines_adjacency";
    __a = &local_d;
    break;
  case 0xb:
    __s = "line_strip_adjacency";
    __a = &local_e;
    break;
  case 0xc:
    __s = "triangles_adjacency";
    __a = &local_12;
    break;
  case 0xd:
    __s = "triangle_strip_adjacency";
    __a = &local_13;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string primitiveTypeToString (GLenum primitive)
{
	switch (primitive)
	{
		case GL_POINTS:						 return "points";
		case GL_LINES:						 return "lines";
		case GL_LINE_LOOP:					 return "line_loop";
		case GL_LINE_STRIP:					 return "line_strip";
		case GL_LINES_ADJACENCY:			 return "lines_adjacency";
		case GL_LINE_STRIP_ADJACENCY:		 return "line_strip_adjacency";
		case GL_TRIANGLES:					 return "triangles";
		case GL_TRIANGLE_STRIP:				 return "triangle_strip";
		case GL_TRIANGLE_FAN:				 return "triangle_fan";
		case GL_TRIANGLES_ADJACENCY:		 return "triangles_adjacency";
		case GL_TRIANGLE_STRIP_ADJACENCY:	 return "triangle_strip_adjacency";
		default:
			DE_ASSERT(DE_FALSE);
			return "error";
	}
}